

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O3

bool __thiscall ON_Localizer::Read(ON_Localizer *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  ON_NurbsCurve *this_00;
  ON_NurbsSurface *this_01;
  byte bVar3;
  byte bVar4;
  bool bReadCurve;
  bool bReadSurface;
  int mjv;
  int mnv;
  int i;
  int major_version;
  int minor_version;
  bool local_3e;
  bool local_3d;
  int local_3c [2];
  ON__INT32 local_34;
  int local_30 [2];
  
  Destroy(this);
  local_30[0] = 0;
  local_30[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_30,local_30 + 1);
  if (!bVar1) {
    return false;
  }
  if (local_30[0] == 1) {
    local_34 = no_type;
    bVar1 = ON_BinaryArchive::ReadInt(archive,&local_34);
    if (bVar1) {
      if (local_34 - sphere_type < 6) {
        this->m_type = local_34;
      }
      bVar1 = ON_BinaryArchive::ReadPoint(archive,&this->m_P);
      if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadVector(archive,&this->m_V), bVar1)) {
        bVar1 = ON_BinaryArchive::ReadInterval(archive,&this->m_d);
        bVar4 = 0;
        if (!bVar1) goto LAB_00537932;
        local_3c[0] = 0;
        local_3c[1] = 0;
        bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_3c,local_3c + 1);
        if (!bVar1) goto LAB_00537932;
        local_3e = false;
        bVar3 = 0;
        if (local_3c[0] == 1) {
          bVar1 = ON_BinaryArchive::ReadBool(archive,&local_3e);
          if (bVar1) {
            bVar3 = 1;
            if (local_3e == true) {
              this_00 = (ON_NurbsCurve *)operator_new(0x40);
              ON_NurbsCurve::ON_NurbsCurve(this_00);
              this->m_nurbs_curve = this_00;
              iVar2 = (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                        [0xb])(this_00,archive);
              bVar3 = (byte)iVar2;
            }
          }
          else {
            bVar3 = 0;
          }
        }
        bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
        bVar4 = 0;
        if (bVar1) {
          bVar4 = bVar3;
        }
        if (bVar4 != 1) goto LAB_00537932;
        bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,local_3c,local_3c + 1);
        if (bVar1) {
          local_3d = false;
          bVar1 = ON_BinaryArchive::ReadBool(archive,&local_3d);
          bVar3 = 0;
          if ((bVar1) && (bVar3 = 1, local_3d == true)) {
            this_01 = (ON_NurbsSurface *)operator_new(0x58);
            ON_NurbsSurface::ON_NurbsSurface(this_01);
            this->m_nurbs_surface = this_01;
            iVar2 = (*(this_01->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                      [0xb])(this_01,archive);
            bVar3 = (byte)iVar2;
          }
          bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
          bVar4 = 0;
          if (bVar1) {
            bVar4 = bVar3;
          }
          goto LAB_00537932;
        }
      }
    }
  }
  bVar4 = 0;
LAB_00537932:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar1 & bVar4);
}

Assistant:

bool ON_Localizer::Read(ON_BinaryArchive& archive)
{
  Destroy();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if ( !rc ) break;

    int i = no_type;
    rc = archive.ReadInt(&i);
    if ( !rc ) break;

    switch(i)
    {
    case sphere_type:   m_type = sphere_type;   break;
    case plane_type:    m_type = plane_type;    break;
    case cylinder_type: m_type = cylinder_type; break;
    case curve_type:    m_type = curve_type;    break;
    case surface_type:  m_type = surface_type;  break;
    case distance_type: m_type = distance_type; break;
    }

    rc = archive.ReadPoint(m_P);
    if ( !rc ) break;
    rc = archive.ReadVector(m_V);
    if ( !rc ) break;
    rc = archive.ReadInterval(m_d);
    if ( !rc ) break;

    int mjv = 0, mnv = 0;
    rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
    if (!rc) break;
    rc = (1 == mjv);
    bool bReadCurve = false;
    if (rc)
      rc = archive.ReadBool( &bReadCurve );
    if ( rc && bReadCurve)
    {
      m_nurbs_curve = new ON_NurbsCurve();
      rc = m_nurbs_curve->Read(archive)?true:false;
    }
    if ( !archive.EndRead3dmChunk() )
      rc = false;
    if (!rc) break;

    rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&mjv,&mnv);
    if (!rc) break;
    rc = (1 == mjv);
    bool bReadSurface = false;
    rc = archive.ReadBool( &bReadSurface );
    if ( rc && bReadSurface )
    {
      m_nurbs_surface = new ON_NurbsSurface();
      rc = m_nurbs_surface->Read(archive)?true:false;
    }
    if ( !archive.EndRead3dmChunk() )
      rc = false;
    if (!rc) break;

    break;
  }
  
  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}